

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O3

uint8_t * bstr_rstrip(uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t *pNext;
  
  if (pBegin < pEnd) {
    do {
      if (0x20 < (ulong)pEnd[-1]) {
        return pEnd;
      }
      if ((0x100002600U >> ((ulong)pEnd[-1] & 0x3f) & 1) == 0) {
        return pEnd;
      }
      pEnd = pEnd + -1;
    } while (pBegin < pEnd);
  }
  return pBegin;
}

Assistant:

const uint8_t *bstr_while_predicate_reverse(const uint8_t *pBegin, const uint8_t *pEnd, int (*pred_func)(int c) )
{
   if (pBegin < pEnd)
   {
      const uint8_t *pNext = pEnd;
      while (pNext > pBegin)
      {
         const uint8_t *pTest = pNext-1;
         int c = (int) *pTest;
         if (!pred_func(c)){
            break;
         }
         pNext--;
      }
      return pNext;
   }
   return pBegin;
}